

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O0

void __thiscall Memory::PagePool::~PagePool(PagePool *this)

{
  PagePoolFreePage *this_00;
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  PagePoolFreePage *page;
  PagePool *this_local;
  
  if (this->freePageList != (PagePoolFreePage *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                       ,0x5c,"(freePageList == nullptr)","freePageList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->reservedPageList != (PagePoolFreePage *)0x0) {
    while (this->reservedPageList != (PagePoolFreePage *)0x0) {
      this_00 = this->reservedPageList;
      bVar2 = PagePoolPage::IsReserved(&this_00->super_PagePoolPage);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                           ,99,"(page->IsReserved())","page->IsReserved()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      this->reservedPageList = this->reservedPageList->nextFreePage;
      PagePoolPage::Free(&this_00->super_PagePoolPage);
    }
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this->pageAllocator);
  return;
}

Assistant:

~PagePool()
    {
        Assert(freePageList == nullptr);

        if (reservedPageList != nullptr)
        {
            while (reservedPageList != nullptr)
            {
                PagePoolFreePage * page = reservedPageList;
                Assert(page->IsReserved());
                reservedPageList = reservedPageList->nextFreePage;
                page->Free();
            }
        }
    }